

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void Excel::Parser::loadGlobals
               (vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> *boundSheets,
               Stream *stream,IStorage *storage)

{
  Exception *pEVar1;
  allocator local_219;
  BOF bof;
  undefined1 local_210 [40];
  Record r;
  
  bof.m_version = UnknownVersion;
  bof.m_type = UnknownType;
  do {
    Record::Record(&r,stream);
    if (r.m_code == 0x22) {
      handleDateMode(&r,storage);
    }
    else if (r.m_code == 0x85) {
      parseBoundSheet((BoundSheet *)local_210,&r,bof.m_version);
      std::vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>::
      emplace_back<Excel::BoundSheet>(boundSheets,(BoundSheet *)local_210);
      std::__cxx11::wstring::~wstring((wstring *)(local_210 + 8));
    }
    else if (r.m_code == 0xfc) {
      parseSST(&r,storage);
    }
    else if (r.m_code == 0x809) {
      BOF::parse(&bof,&r);
    }
    else {
      if (r.m_code == 10) {
        Record::~Record(&r);
        return;
      }
      if (r.m_code == 0x2f) {
        pEVar1 = (Exception *)__cxa_allocate_exception(0x30);
        std::__cxx11::wstring::wstring
                  ((wstring *)local_210,
                   L"This file is protected. Decryption is not implemented yet.",&local_219);
        Exception::Exception(pEVar1,(wstring *)local_210);
        __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
      }
      if (r.m_code == 0xffff) {
        pEVar1 = (Exception *)__cxa_allocate_exception(0x30);
        std::__cxx11::wstring::wstring((wstring *)local_210,L"Wrong format.",&local_219);
        Exception::Exception(pEVar1,(wstring *)local_210);
        __cxa_throw(pEVar1,&Exception::typeinfo,Exception::~Exception);
      }
    }
    Record::~Record(&r);
  } while( true );
}

Assistant:

inline void
Parser::loadGlobals( std::vector< BoundSheet > & boundSheets, 
	Stream & stream, IStorage & storage )
{
	BOF bof;

	while( true )
	{
		Record r( stream );

		switch( r.code() )
		{
			case XL_BOF :
				bof.parse( r );
				break;

			case XL_FILEPASS :
				throw Exception( L"This file is protected. Decryption is not implemented yet." );

			case XL_SST :
				parseSST( r, storage );
				break;

			case XL_BOUNDSHEET :
				boundSheets.push_back( parseBoundSheet( r, bof.version() ) );
				break;

			case XL_DATEMODE :
				handleDateMode( r, storage );
				break;

			case XL_EOF :
				return;

			case XL_UNKNOWN :
				throw Exception( L"Wrong format." );

			default:
				break;
		}
	}
}